

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::compute::anon_unknown_0::BufferToBufferInvertTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferToBufferInvertTestInstance *this)

{
  uint *puVar1;
  uint *puVar2;
  ProgramCollection<vk::ProgramBinary> *this_00;
  DeviceInterface *vkd;
  TestStatus *__return_storage_ptr___00;
  Allocation *pAVar3;
  deUint32 queueFamilyIndex;
  deUint32 dVar4;
  VkDevice pVVar5;
  DescriptorSetLayoutBuilder *pDVar6;
  DescriptorPoolBuilder *pDVar7;
  DescriptorSetUpdateBuilder *pDVar8;
  ProgramBinary *binary;
  ostream *poVar9;
  deUint32 i;
  ulong uVar10;
  long lVar11;
  VkDeviceSize bufferSize;
  long lVar12;
  VkDescriptorType descriptorType;
  deUint32 *pdVar13;
  bool bVar14;
  RefBase<vk::VkCommandBuffer_s_*> local_408;
  DeviceInterface *local_3e0;
  TestStatus *local_3d8;
  VkQueue local_3d0;
  Allocator *local_3c8;
  VkDevice local_3c0;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_3b8;
  VkBufferMemoryBarrier hostWriteBarrier;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_358;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_338;
  VkDescriptorBufferInfo outputBufferDescriptorInfo;
  VkDescriptorBufferInfo inputBufferDescriptorInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_2e8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_2c8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_2a8;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_288;
  string local_268;
  Buffer inputBuffer;
  Buffer outputBuffer;
  Random rnd;
  VkBufferMemoryBarrier shaderWriteBarrier;
  
  local_3d8 = __return_storage_ptr__;
  local_3e0 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getDevice((this->super_TestInstance).m_context);
  local_3d0 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_3c8 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  bVar14 = this->m_bufferType == BUFFER_TYPE_UNIFORM;
  dVar4 = 0x124fef;
  if (bVar14) {
    dVar4 = 0x111223f;
  }
  bufferSize = (ulong)this->m_numValues << 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,(uint)!bVar14 * 0x10 + 0x10);
  local_3c0 = pVVar5;
  compute::Buffer::Buffer
            (&inputBuffer,local_3e0,pVVar5,local_3c8,(VkBufferCreateInfo *)&rnd,
             (MemoryRequirement)0x1);
  deRandom_init(&rnd.m_rnd,dVar4);
  pAVar3 = inputBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  vkd = local_3e0;
  descriptorType = bVar14 ^ VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  pdVar13 = (deUint32 *)
            (inputBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
            m_hostPtr;
  for (uVar10 = 0; pVVar5 = local_3c0, uVar10 < this->m_numValues; uVar10 = uVar10 + 1) {
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    *pdVar13 = dVar4;
    pdVar13 = pdVar13 + 4;
  }
  ::vk::flushMappedMemoryRange
            (vkd,local_3c0,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,bufferSize
            );
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,0x20);
  compute::Buffer::Buffer
            (&outputBuffer,vkd,pVVar5,local_3c8,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&rnd);
  pDVar6 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     ((DescriptorSetLayoutBuilder *)&rnd,descriptorType,0x20);
  pDVar6 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar6,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&hostWriteBarrier,pDVar6,vkd,pVVar5,0);
  local_338.m_data.deleter.m_device = (VkDevice)hostWriteBarrier._16_8_;
  local_338.m_data.deleter.m_allocator = (VkAllocationCallbacks *)hostWriteBarrier._24_8_;
  local_338.m_data.object.m_internal = hostWriteBarrier._0_8_;
  local_338.m_data.deleter.m_deviceIface = (DeviceInterface *)hostWriteBarrier.pNext;
  hostWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  hostWriteBarrier._4_4_ = 0;
  hostWriteBarrier.pNext = (void *)0x0;
  hostWriteBarrier.srcAccessMask = 0;
  hostWriteBarrier.dstAccessMask = 0;
  hostWriteBarrier.srcQueueFamilyIndex = 0;
  hostWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&hostWriteBarrier);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&rnd);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&hostWriteBarrier);
  pDVar7 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&hostWriteBarrier,descriptorType,1);
  pDVar7 = ::vk::DescriptorPoolBuilder::addType(pDVar7,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&rnd,pDVar7,vkd,pVVar5,1,1);
  local_288.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_288.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_288.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&rnd);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&hostWriteBarrier);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&rnd,vkd,pVVar5,
                    (VkDescriptorPool)local_288.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_338.m_data.object.m_internal);
  local_3b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_3b8.m_data.deleter.m_pool.m_internal = 0;
  local_3b8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_3b8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_3b8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&rnd);
  inputBufferDescriptorInfo.buffer.m_internal =
       inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  inputBufferDescriptorInfo.offset = 0;
  outputBufferDescriptorInfo.buffer.m_internal =
       outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  outputBufferDescriptorInfo.offset = 0;
  outputBufferDescriptorInfo.range = bufferSize;
  inputBufferDescriptorInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&rnd);
  hostWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  hostWriteBarrier._4_4_ = 0;
  pDVar8 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     ((DescriptorSetUpdateBuilder *)&rnd,
                      (VkDescriptorSet)local_3b8.m_data.object.m_internal,
                      (Location *)&hostWriteBarrier,descriptorType,&inputBufferDescriptorInfo);
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  shaderWriteBarrier._4_4_ = 0;
  pDVar8 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar8,(VkDescriptorSet)local_3b8.m_data.object.m_internal,
                      (Location *)&shaderWriteBarrier,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                      &outputBufferDescriptorInfo);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar8,vkd,pVVar5);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&rnd);
  this_00 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hostWriteBarrier,"comp",(allocator<char> *)&shaderWriteBarrier);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&hostWriteBarrier);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&rnd,vkd,pVVar5,binary,0);
  local_2a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_2a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_2a8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_2a8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_2a8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&rnd);
  std::__cxx11::string::~string((string *)&hostWriteBarrier);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&rnd,vkd,pVVar5,
                     (VkDescriptorSetLayout)local_338.m_data.object.m_internal);
  local_358.m_data.deleter.m_device = (VkDevice)0x0;
  local_358.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_358.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_358.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_358.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&rnd);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&rnd,vkd,pVVar5,
                      (VkPipelineLayout)local_358.m_data.object.m_internal,
                      (VkShaderModule)local_2a8.m_data.object.m_internal);
  local_2c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_2c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_2c8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_2c8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_2c8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&rnd);
  makeBufferMemoryBarrier
            (&hostWriteBarrier,0x4000,0x20,
             (VkBuffer)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeBufferMemoryBarrier
            (&shaderWriteBarrier,0x40,0x2000,
             (VkBuffer)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&rnd,vkd,pVVar5,queueFamilyIndex);
  local_2e8.m_data.deleter.m_device = (VkDevice)0x0;
  local_2e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_2e8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_2e8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_2e8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&rnd);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&rnd,vkd,pVVar5,
             (VkCommandPool)local_2e8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_408.m_data.deleter.m_device = (VkDevice)0x0;
  local_408.m_data.deleter.m_pool.m_internal = 0;
  local_408.m_data.object = (VkCommandBuffer_s *)rnd.m_rnd._0_8_;
  local_408.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&rnd);
  beginCommandBuffer(vkd,local_408.m_data.object);
  (*vkd->_vptr_DeviceInterface[0x4c])
            (vkd,local_408.m_data.object,1,local_2c8.m_data.object.m_internal);
  (*vkd->_vptr_DeviceInterface[0x56])
            (vkd,local_408.m_data.object,1,local_358.m_data.object.m_internal,0,1,&local_3b8,0,0);
  (*vkd->_vptr_DeviceInterface[0x6d])
            (vkd,local_408.m_data.object,0x4000,0x800,0,0,0,1,&hostWriteBarrier,0,0);
  (*vkd->_vptr_DeviceInterface[0x5d])
            (vkd,local_408.m_data.object,(ulong)(uint)(this->m_workSize).m_data[0],
             (ulong)(uint)(this->m_workSize).m_data[1]);
  (*vkd->_vptr_DeviceInterface[0x6d])
            (vkd,local_408.m_data.object,0x800,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
  endCommandBuffer(vkd,local_408.m_data.object);
  submitCommandsAndWait(vkd,pVVar5,local_3d0,local_408.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (vkd,pVVar5,
             (VkDeviceMemory)
             ((outputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (outputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  __return_storage_ptr___00 = local_3d8;
  lVar11 = 1;
  lVar12 = 0;
  do {
    if ((ulong)this->m_numValues + lVar11 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rnd,"Compute succeeded",(allocator<char> *)&local_268);
      tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&rnd);
      std::__cxx11::string::~string((string *)&rnd);
      goto LAB_006c103c;
    }
    puVar1 = (uint *)((long)(inputBuffer.m_allocation.
                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                             m_data.ptr)->m_hostPtr + lVar12);
    puVar2 = (uint *)((long)(outputBuffer.m_allocation.
                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                             m_data.ptr)->m_hostPtr + lVar12);
    lVar11 = lVar11 + -1;
    lVar12 = lVar12 + 0x10;
  } while ((*puVar1 ^ *puVar2) == 0xffffffff);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
  poVar9 = std::operator<<((ostream *)&rnd,"Comparison failed for Output.values[");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::operator<<(poVar9,"]");
  std::__cxx11::stringbuf::str();
  tcu::TestStatus::fail(__return_storage_ptr___00,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
LAB_006c103c:
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_408);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_2e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_2c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_358);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_2a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_3b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_288);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_338);
  compute::Buffer::~Buffer(&outputBuffer);
  compute::Buffer::~Buffer(&inputBuffer);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BufferToBufferInvertTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Customize the test based on buffer type

	const VkBufferUsageFlags inputBufferUsageFlags		= (m_bufferType == BUFFER_TYPE_UNIFORM ? VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT : VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
	const VkDescriptorType inputBufferDescriptorType	= (m_bufferType == BUFFER_TYPE_UNIFORM ? VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER : VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);
	const deUint32 randomSeed							= (m_bufferType == BUFFER_TYPE_UNIFORM ? 0x111223f : 0x124fef);

	// Create an input buffer

	const VkDeviceSize bufferSizeBytes = sizeof(tcu::UVec4) * m_numValues;
	const Buffer inputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, inputBufferUsageFlags), MemoryRequirement::HostVisible);

	// Fill the input buffer with data
	{
		de::Random rnd(randomSeed);
		const Allocation& inputBufferAllocation = inputBuffer.getAllocation();
		tcu::UVec4* bufferPtr = static_cast<tcu::UVec4*>(inputBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < m_numValues; ++i)
			bufferPtr[i].x() = rnd.getUint32();

		flushMappedMemoryRange(vk, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), bufferSizeBytes);
	}

	// Create an output buffer

	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(inputBufferDescriptorType, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(inputBufferDescriptorType)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo inputBufferDescriptorInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, bufferSizeBytes);
	const VkDescriptorBufferInfo outputBufferDescriptorInfo = makeDescriptorBufferInfo(*outputBuffer, 0ull, bufferSizeBytes);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), inputBufferDescriptorType, &inputBufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &outputBufferDescriptorInfo)
		.update(vk, device);

	// Perform the computation

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const VkBufferMemoryBarrier hostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *inputBuffer, 0ull, bufferSizeBytes);

	const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, bufferSizeBytes);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &hostWriteBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &shaderWriteBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	// Wait for completion

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), bufferSizeBytes);

	const tcu::UVec4* bufferPtr = static_cast<tcu::UVec4*>(outputBufferAllocation.getHostPtr());
	const tcu::UVec4* refBufferPtr = static_cast<tcu::UVec4*>(inputBuffer.getAllocation().getHostPtr());

	for (deUint32 ndx = 0; ndx < m_numValues; ++ndx)
	{
		const deUint32 res = bufferPtr[ndx].x();
		const deUint32 ref = ~refBufferPtr[ndx].x();

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for Output.values[" << ndx << "]";
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}